

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readPartialLine.hpp
# Opt level: O1

void njoy::ENDFtk::record::Zipper::
     readPartialLine<njoy::ENDFtk::record::Zipper::Zipped<njoy::ENDFtk::record::Integer<11>,njoy::ENDFtk::record::Integer<11>>,std::tuple<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,0ul,1ul>
               (long nEntries,long *iteratorTuple,
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *it,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *end,long *lineNumber,int MAT,int MF,int MT)

{
  long lVar1;
  long lVar2;
  long lVar3;
  undefined8 *puVar4;
  long lVar5;
  int local_44;
  int local_40;
  TailVerification<0,njoy::ENDFtk::record::TailVerification<1,njoy::ENDFtk::record::TailVerification<2,njoy::ENDFtk::record::Tail>>>
  local_3c [12];
  
  if (nEntries != 0) {
    lVar5 = 0;
    do {
      lVar3 = *iteratorTuple;
      lVar2 = iteratorTuple[1];
      lVar1 = tools::disco::Integer<11u>::
              read<long,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>(it,end);
      *(long *)(lVar2 + lVar5 * 8) = lVar1;
      lVar2 = tools::disco::Integer<11u>::
              read<long,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>(it,end);
      *(long *)(lVar3 + lVar5 * 8) = lVar2;
      lVar5 = lVar5 + 1;
    } while (nEntries != lVar5);
  }
  nEntries = nEntries + -4;
  do {
    nEntries = nEntries + 1;
    if (nEntries == 0) {
      local_40 = MF;
      local_44 = MT;
      TailVerification<0,njoy::ENDFtk::record::TailVerification<1,njoy::ENDFtk::record::TailVerification<2,njoy::ENDFtk::record::Tail>>>
      ::
      TailVerification<int&,int&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,long&>
                (local_3c,MAT,&local_40,&local_44,it,end,lineNumber);
      return;
    }
    lVar5 = tools::disco::Integer<11u>::
            read<long,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>(it,end);
    lVar3 = tools::disco::Integer<11u>::
            read<long,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>(it,end);
  } while (lVar3 == 0 && lVar5 == 0);
  tools::Log::error<char_const*>("Encountered non-default value where none was expected");
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = getenv;
  __cxa_throw(puVar4,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
readPartialLine
( uint64_t nEntries, Tuple& iteratorTuple, Iterator& it, const Iterator& end,
  long& lineNumber, int MAT, int MF, int MT,
  std::index_sequence< indices... > ){

  using namespace njoy::tools;

//auto increment = []( uint64_t offset, auto& iterator ){ iterator+= offset; };

  for ( uint64_t offset = 0; offset < nEntries; ++offset ){
    Zip::TupleFormat::read
      ( it, end, std::get< indices >( iteratorTuple )[offset]... );
  }

  auto remainingEntries = Zip::tuplesPerRecord - nEntries;
  std::tuple< typename Zip:: template Type< indices >... > leftovers;

  while ( remainingEntries-- ){
    Zip::TupleFormat::read( it, end, std::get< indices >( leftovers )... );
    if ( leftovers != Zip::defaultTuple() ){
      Log::error( "Encountered non-default value where none was expected" );
      throw std::exception();
    }
  }

  using Gap = disco::Record
              < disco::Column< Zip::nPad >, disco::RetainCarriage >;

  Gap::read( it, end );

  verifyTail( it, end, lineNumber, MAT, MF, MT );
}